

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

int __thiscall
ccs::Value::accept<int,ccs::(anonymous_namespace)::Caster<int>>(Value *this,Caster<int> *visitor)

{
  ostream *this_00;
  runtime_error *this_01;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream msg;
  Caster<int> *visitor_local;
  Value *this_local;
  
  switch(this->which_) {
  case String:
    this_local._4_4_ =
         (anonymous_namespace)::Caster<int>::operator()((Caster<int> *)visitor,&this->rawStringVal_)
    ;
    break;
  case Int:
    this_local._4_4_ =
         (anonymous_namespace)::Caster<int>::operator()
                   ((Caster<int> *)visitor,&(this->rawPrimVal_).intVal);
    break;
  case Double:
    this_local._4_4_ =
         (anonymous_namespace)::Caster<int>::operator()
                   ((Caster<int> *)visitor,&(this->rawPrimVal_).doubleVal);
    break;
  case Bool:
    this_local._4_4_ =
         (anonymous_namespace)::Caster<int>::operator()
                   ((Caster<int> *)visitor,&(this->rawPrimVal_).boolVal);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_198);
    this_00 = std::operator<<((ostream *)local_198,"Bad enum value ");
    std::ostream::operator<<(this_00,this->which_);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_01,local_1c8);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return this_local._4_4_;
}

Assistant:

S Value::accept(V &&visitor) const {
  switch (which_) {
    case String: return visitor(rawStringVal_);
    case Int: return visitor(rawPrimVal_.intVal);
    case Double: return visitor(rawPrimVal_.doubleVal);
    case Bool: return visitor(rawPrimVal_.boolVal);
  }
  std::ostringstream msg;
  msg << "Bad enum value " << which_;
  throw std::runtime_error(msg.str());
}